

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_call_detail.hpp
# Opt level: O0

function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_chaiscript::Boxed_Value_&)>
* __thiscall
chaiscript::dispatch::detail::
build_function_caller_helper<std::__cxx11::string,chaiscript::Boxed_Value_const&>
          (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_chaiscript::Boxed_Value_&)>
           *__return_storage_ptr__,detail *this,
          _func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_Boxed_Value_ptr
          *param_1,vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
                   *funcs,Type_Conversions_State *t_conversions)

{
  Type_Conversions *local_88;
  vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
  local_60;
  Build_Function_Caller_Helper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_chaiscript::Boxed_Value_&>
  local_48;
  Type_Conversions_State *local_28;
  Type_Conversions_State *t_conversions_local;
  vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
  *funcs_local;
  _func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_Boxed_Value_ptr
  *param_0_local;
  
  local_28 = (Type_Conversions_State *)funcs;
  t_conversions_local = (Type_Conversions_State *)param_1;
  funcs_local = (vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
                 *)this;
  param_0_local =
       (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_Boxed_Value_ptr *)
       __return_storage_ptr__;
  std::
  vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
  ::vector(&local_60,
           (vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
            *)param_1);
  if (local_28 == (Type_Conversions_State *)0x0) {
    local_88 = (Type_Conversions *)0x0;
  }
  else {
    local_88 = Type_Conversions_State::get(local_28);
  }
  Build_Function_Caller_Helper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_chaiscript::Boxed_Value_&>
  ::Build_Function_Caller_Helper(&local_48,&local_60,local_88);
  std::function<std::__cxx11::string(chaiscript::Boxed_Value_const&)>::
  function<chaiscript::dispatch::detail::Build_Function_Caller_Helper<std::__cxx11::string,chaiscript::Boxed_Value_const&>,void>
            ((function<std::__cxx11::string(chaiscript::Boxed_Value_const&)> *)
             __return_storage_ptr__,&local_48);
  Build_Function_Caller_Helper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_chaiscript::Boxed_Value_&>
  ::~Build_Function_Caller_Helper(&local_48);
  std::
  vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
  ::~vector(&local_60);
  return __return_storage_ptr__;
}

Assistant:

std::function<Ret(Params...)>
  build_function_caller_helper(Ret(Params...), const std::vector<Const_Proxy_Function> &funcs, const Type_Conversions_State *t_conversions) {
    /*
    if (funcs.size() == 1)
    {
      std::shared_ptr<const Proxy_Function_Impl<Ret (Params...)>> pfi =
        std::dynamic_pointer_cast<const Proxy_Function_Impl<Ret (Params...)> >
          (funcs[0]);

      if (pfi)
      {
        return pfi->internal_function();
      }
      // looks like this either wasn't a Proxy_Function_Impl or the types didn't match
      // we cannot make any other guesses or assumptions really, so continuing
    }
  */

    return std::function<Ret(Params...)>(Build_Function_Caller_Helper<Ret, Params...>(funcs, t_conversions ? t_conversions->get() : nullptr));
  }